

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

String * __thiscall
LiteScript::Character::operator*(String *__return_storage_ptr__,Character *this,uint nb)

{
  String cpy;
  String local_40;
  
  (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2;
  (__return_storage_ptr__->str)._M_string_length = 0;
  (__return_storage_ptr__->str).field_2._M_local_buf[0] = L'\0';
  String::String(&local_40,(this->str->str)._M_dataplus._M_p[this->i]);
  if (nb != 0) {
    do {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      _M_append(&__return_storage_ptr__->str,local_40.str._M_dataplus._M_p,
                local_40.str._M_string_length);
      nb = nb - 1;
    } while (nb != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_40.str._M_dataplus._M_p != &local_40.str.field_2) {
    operator_delete(local_40.str._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

LiteScript::String LiteScript::Character::operator*(unsigned int nb) const {
    String res, cpy(this->str[this->i]);
    for (unsigned int j = 0; j < nb; j++)
        res += cpy;
    return res;
}